

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmScriptGenerator.cxx
# Opt level: O1

void __thiscall
cmScriptGenerator::cmScriptGenerator
          (cmScriptGenerator *this,string *config_var,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *configurations)

{
  pointer pcVar1;
  
  this->_vptr_cmScriptGenerator = (_func_int **)&PTR__cmScriptGenerator_006f2048;
  (this->RuntimeConfigVariable)._M_dataplus._M_p = (pointer)&(this->RuntimeConfigVariable).field_2;
  pcVar1 = (config_var->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->RuntimeConfigVariable,pcVar1,pcVar1 + config_var->_M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Configurations,configurations);
  (this->ConfigurationName)._M_dataplus._M_p = (pointer)&(this->ConfigurationName).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->ConfigurationName,"");
  this->ConfigurationTypes =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)0x0;
  this->ActionsPerConfig = false;
  return;
}

Assistant:

cmScriptGenerator::cmScriptGenerator(
  const std::string& config_var,
  std::vector<std::string> const& configurations)
  : RuntimeConfigVariable(config_var)
  , Configurations(configurations)
  , ConfigurationName("")
  , ConfigurationTypes(CM_NULLPTR)
  , ActionsPerConfig(false)
{
}